

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

string * __thiscall
Node::OutputVarName_abi_cxx11_(string *__return_storage_ptr__,Node *this,Node *array,int InDefine)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VariableStruct *this_00;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  string local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = VariableList::Lookup(Variables,&this->TextValue,array,0);
  if (this_00 == (VariableStruct *)0x0) {
    genname(&local_98,&this->TextValue);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((char)((InDefine & 2U) >> 1) != '\0' || array == (Node *)0x0) {
      return __return_storage_ptr__;
    }
  }
  else {
    VariableStruct::GetName_abi_cxx11_(&local_98,this_00,InDefine & 1);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
    paVar1 = &local_98.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((char)((InDefine & 2U) >> 1) != '\0' || array == (Node *)0x0) {
      return __return_storage_ptr__;
    }
    if (this_00->Class == VARCLASS_FUNC) {
      NoParen_abi_cxx11_(&local_58,array);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x12d688);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_68 = *plVar3;
        lStack_60 = plVar2[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar3;
        local_78 = (long *)*plVar2;
      }
      local_70 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_78);
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_98.field_2._M_allocated_capacity = *psVar4;
        local_98.field_2._8_8_ = plVar2[3];
        local_98._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar4;
        local_98._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_98._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,local_68 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == &local_58.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
  }
  do {
    OutputArrayParam_abi_cxx11_(&local_58,array,InDefine);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x12dc3e);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_68 = *plVar3;
      lStack_60 = plVar2[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar3;
      local_78 = (long *)*plVar2;
    }
    local_70 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_78);
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_98.field_2._M_allocated_capacity = *psVar4;
      local_98.field_2._8_8_ = plVar2[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar4;
      local_98._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_98._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    array = array->Block[0];
  } while (array != (Node *)0x0);
  return __return_storage_ptr__;
}

Assistant:

std::string Node::OutputVarName(
	Node* array,		/**< Pointer to any array references */
	int InDefine		/**< Is this part of a definition,
       					bit 1 = Yes, bit2 = Don't add array dims*/
)
{
	int flags = 0;		// GetName flags

	if (InDefine & 1)
	{
		//
		// We don't want the prefix on the definition, since the
		// class name is already handled by the 'class' definition.
		//
		flags |= 1;
	}

	//
	// Local Variables
	//
	VariableStruct *ThisVar;
	std::string result;

	//
	// Look for variable in table
	//
	ThisVar = Variables->Lookup(TextValue, array);

	//
	// Make up a good name to print for this variable
	//
	if (ThisVar != 0)
	{
		result = ThisVar->GetName(flags);
	}
	else
	{
		result = genname(TextValue);
	}

	//
	// Handle array references (May need to be modified from x[a,b]
	// to x[a][b] manually.
	//
	if (array != 0 && (InDefine & 2) == 0)
	{
		if ((ThisVar != 0) && (ThisVar->Class == VARCLASS_FUNC))
		{
			result += "(" + array->NoParen() + ")";
		}
		else
		{
			while(array != 0)
			{
				result += "[" + array->OutputArrayParam(InDefine) + "]";
				array = array->Block[0];
			}
		}
	}

	return result;
}